

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilter.cpp
# Opt level: O0

bool __thiscall TestFilter::match(TestFilter *this,SimpleString *name)

{
  SimpleString *in_RDI;
  bool matches;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_11;
  
  if (((ulong)in_RDI[1].buffer_ & 1) == 0) {
    local_11 = SimpleString::contains
                         (in_RDI,(SimpleString *)
                                 CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  else {
    local_11 = ::operator==(in_RDI,(SimpleString *)
                                   CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  if (((ulong)in_RDI[1].buffer_ & 0x100) != 0) {
    local_11 = (bool)(local_11 ^ 0xff);
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool TestFilter::match(const SimpleString& name) const
{
    bool matches = false;

    if(strictMatching_)
        matches = name == filter_;
    else
        matches = name.contains(filter_);

    return invertMatching_ ? !matches : matches;
}